

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::initBindingPoints
          (LayoutBindingRenderCase *this,int minBindingPoint,int numBindingPoints)

{
  pointer *ppuVar1;
  deUint32 dVar2;
  char *str;
  reference pvVar3;
  int local_c4;
  int local_c0;
  int local_bc;
  int ndx_2;
  GLint binding_1;
  int local_b0;
  int ndx_1;
  GLint binding;
  int bpoint_4;
  int bpoint_3;
  int ndx;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  uint *local_90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  value_type_conflict4 local_80;
  value_type_conflict4 local_7c;
  value_type_conflict4 local_78;
  int bpoint_2;
  undefined1 local_70 [4];
  int bpoint_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> highBindingPoints;
  vector<unsigned_int,_std::allocator<unsigned_int>_> lowBindingPoints;
  int local_2c;
  undefined1 local_28 [4];
  int bpoint;
  Random rnd;
  int numBindingPoints_local;
  int minBindingPoint_local;
  LayoutBindingRenderCase *this_local;
  
  rnd.m_rnd.z = numBindingPoints;
  rnd.m_rnd.w = minBindingPoint;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)local_28,dVar2 ^ 0xff23a4);
  switch(this->m_testType) {
  case TESTTYPE_BINDING_SINGLE:
    local_2c = de::Random::getInt((Random *)local_28,rnd.m_rnd.w,rnd.m_rnd.z - 1);
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&local_2c);
    break;
  case TESTTYPE_BINDING_MAX:
    lowBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = rnd.m_rnd.z - 1;
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->m_bindings,
               (value_type_conflict1 *)
               &lowBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case TESTTYPE_BINDING_MULTIPLE:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    for (bpoint_2 = 0; bpoint_2 < (int)rnd.m_rnd.z / 2; bpoint_2 = bpoint_2 + 1) {
      local_78 = bpoint_2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_78);
    }
    for (local_7c = (int)rnd.m_rnd.z / 2; (int)local_7c < (int)rnd.m_rnd.z; local_7c = local_7c + 1)
    {
      local_80 = local_7c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,&local_80);
    }
    ppuVar1 = &highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
    local_90 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((Random *)local_28,local_88,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_90);
    local_98._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    _bpoint_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((Random *)local_28,local_98,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )_bpoint_3);
    for (bpoint_4 = 0; bpoint_4 < this->m_numBindings; bpoint_4 = bpoint_4 + 1) {
      if (bpoint_4 % 2 == 0) {
        ppuVar1 = &highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
        binding = *pvVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
        std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&binding);
      }
      else {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        ndx_1 = *pvVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&ndx_1);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case TESTTYPE_BINDING_ARRAY:
    local_b0 = de::Random::getInt((Random *)local_28,rnd.m_rnd.w,rnd.m_rnd.z - this->m_numBindings);
    for (binding_1 = 0; binding_1 < this->m_numBindings; binding_1 = binding_1 + 1) {
      ndx_2 = local_b0 + binding_1;
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&ndx_2);
    }
    break;
  case TESTTYPE_BINDING_MAX_ARRAY:
    local_bc = rnd.m_rnd.z - this->m_numBindings;
    for (local_c0 = 0; local_c0 < this->m_numBindings; local_c0 = local_c0 + 1) {
      local_c4 = local_bc + local_c0;
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&local_c4);
    }
  }
  de::Random::~Random((Random *)local_28);
  return;
}

Assistant:

void LayoutBindingRenderCase::initBindingPoints (int minBindingPoint, int numBindingPoints)
{
	de::Random rnd(deStringHash(getName()) ^ 0xff23a4);

	switch (m_testType)
	{
		case TESTTYPE_BINDING_SINGLE:
		{
			const int bpoint = rnd.getInt(minBindingPoint, numBindingPoints-1);
			m_bindings.push_back(bpoint);
			break;
		}

		case TESTTYPE_BINDING_MAX:
			m_bindings.push_back(numBindingPoints-1);
			break;

		case TESTTYPE_BINDING_MULTIPLE:
		{
			// Choose multiple unique binding points from the low and high end of available binding points
			std::vector<deUint32> lowBindingPoints;
			std::vector<deUint32> highBindingPoints;

			for (int bpoint = 0; bpoint < numBindingPoints/2; ++bpoint)
				lowBindingPoints.push_back(bpoint);
			for (int bpoint = numBindingPoints/2; bpoint < numBindingPoints; ++bpoint)
				highBindingPoints.push_back(bpoint);

			rnd.shuffle(lowBindingPoints.begin(), lowBindingPoints.end());
			rnd.shuffle(highBindingPoints.begin(), highBindingPoints.end());

			for (int ndx = 0; ndx < m_numBindings; ++ndx)
			{
				if (ndx%2 == 0)
				{
					const int bpoint = lowBindingPoints.back();
					lowBindingPoints.pop_back();
					m_bindings.push_back(bpoint);
				}
				else
				{
					const int bpoint = highBindingPoints.back();
					highBindingPoints.pop_back();
					m_bindings.push_back(bpoint);
				}

			}
			break;
		}

		case TESTTYPE_BINDING_ARRAY:
		{
			const glw::GLint binding = rnd.getInt(minBindingPoint, numBindingPoints-m_numBindings);
			for (int ndx = 0; ndx < m_numBindings; ++ndx)
				m_bindings.push_back(binding+ndx);
			break;
		}

		case TESTTYPE_BINDING_MAX_ARRAY:
		{
			const glw::GLint binding = numBindingPoints-m_numBindings;
			for (int ndx = 0; ndx < m_numBindings; ++ndx)
				m_bindings.push_back(binding+ndx);
			break;
		}

		default:
			DE_ASSERT(false);
	}
}